

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_strto(jit_State *J)

{
  int iVar1;
  TValue local_38;
  TValue n;
  jit_State *J_local;
  TValue local_20;
  TValue tv;
  TValue local_10;
  
  n = (TValue)J;
  iVar1 = lj_strscan_num((GCstr *)(J->fold).left[1],&local_38);
  if (iVar1 == 0) {
    J_local._4_4_ = 3;
  }
  else {
    local_10 = n;
    tv.u64 = local_38.u64;
    local_20 = local_38;
    J_local._4_4_ = lj_ir_knum_u64((jit_State *)n,local_38.u64);
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(STRTO KGC)
LJFOLDF(kfold_strto)
{
  TValue n;
  if (lj_strscan_num(ir_kstr(fleft), &n))
    return lj_ir_knum(J, numV(&n));
  return FAILFOLD;
}